

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_permute_axes<unsigned_char>
          (CImg<unsigned_char> *__return_storage_ptr__,CImg<unsigned_char> *this,char *axes_order,
          uchar *param_2)

{
  uint uVar1;
  uint uVar2;
  uint size_z;
  CImgArgumentException *this_00;
  long lVar3;
  uchar *puVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  uchar *puVar15;
  bool bVar16;
  CImg<unsigned_char> local_58;
  uchar s_code [4];
  uchar n_code [4];
  
  puVar15 = this->_data;
  uVar1 = this->_width;
  uVar2 = this->_height;
  size_z = this->_depth;
  bVar16 = true;
  if ((size_z != 0 && uVar2 != 0) && (uVar1 != 0 && puVar15 != (uchar *)0x0)) {
    bVar16 = this->_spectrum == 0;
  }
  if ((axes_order == (char *)0x0) || (bVar16)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  local_58._data = (uchar *)0x0;
  local_58._width = 0;
  local_58._height = 0;
  local_58._depth = 0;
  local_58._spectrum = 0;
  local_58._is_shared = false;
  s_code[0] = '\0';
  s_code[1] = '\x01';
  s_code[2] = '\x02';
  s_code[3] = '\x03';
  n_code[0] = '\0';
  n_code[1] = '\0';
  n_code[2] = '\0';
  n_code[3] = '\0';
  bVar5 = *axes_order;
  if (bVar5 != 0) {
    lVar3 = 0;
    do {
      bVar6 = bVar5 + 0x20;
      if ((byte)(bVar5 + 0xa5) < 0xe6) {
        bVar6 = bVar5;
      }
      if ((lVar3 == 4) || ((2 < bVar6 - 0x78 && (bVar6 != 99)))) {
        s_code[0] = '\x04';
        break;
      }
      uVar7 = bVar6 & 3;
      n_code[uVar7] = n_code[uVar7] + '\x01';
      s_code[lVar3] = (uchar)uVar7;
      bVar5 = axes_order[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (bVar5 != 0);
  }
  if (((((*axes_order == '\0') || (3 < s_code[0])) || (1 < n_code[0])) ||
      ((1 < n_code[1] || (1 < n_code[2])))) || (1 < n_code[3])) goto LAB_0018cc3b;
  uVar7 = (uint)s_code >> 0x18 |
          ((uint)s_code >> 0x10 & 0xff) << 4 | ((uint)s_code >> 8 & 0xff) << 8 |
          ((uint)s_code & 0xff) << 0xc;
  if (0x2012 < uVar7) {
    if (uVar7 < 0x3012) {
      if (uVar7 < 0x2130) {
        if (uVar7 == 0x2013) {
          assign(&local_58,size_z,uVar1,uVar2,this->_spectrum);
          if (0 < (int)this->_spectrum) {
            lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
            lVar8 = 0;
            do {
              if (0 < (int)this->_depth) {
                iVar9 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar11 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        lVar13 = 0;
                        do {
                          local_58._data
                          [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar8 +
                           (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar11] =
                               puVar15[lVar13];
                          lVar13 = lVar13 + 1;
                        } while ((int)lVar13 < (int)this->_width);
                        puVar15 = puVar15 + lVar13;
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 < (int)this->_height);
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 < (int)this->_depth);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)this->_spectrum);
          }
        }
        else if (uVar7 == 0x2031) {
          assign(&local_58,size_z,uVar1,this->_spectrum,uVar2);
          if (0 < (int)this->_spectrum) {
            lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
            lVar8 = 0;
            do {
              if (0 < (int)this->_depth) {
                iVar9 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar11 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        lVar13 = 0;
                        do {
                          local_58._data
                          [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                           (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar8] =
                               puVar15[lVar13];
                          lVar13 = lVar13 + 1;
                        } while ((int)lVar13 < (int)this->_width);
                        puVar15 = puVar15 + lVar13;
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 < (int)this->_height);
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 < (int)this->_depth);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)this->_spectrum);
          }
        }
        else if ((uVar7 == 0x2103) &&
                (assign(&local_58,size_z,uVar2,uVar1,this->_spectrum), 0 < (int)this->_spectrum)) {
          lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
          lVar8 = 0;
          lVar11 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar9 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar10 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar12 = 0;
                      lVar13 = lVar8;
                      do {
                        local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                             puVar15[lVar12];
                        lVar12 = lVar12 + 1;
                        lVar13 = lVar13 + lVar3;
                      } while (lVar12 < (int)this->_width);
                      puVar15 = puVar15 + lVar12;
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < (int)this->_height);
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < (int)this->_depth);
            }
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
          } while (lVar11 < (int)this->_spectrum);
        }
      }
      else if (uVar7 == 0x2130) {
        assign(&local_58,size_z,uVar2,this->_spectrum,uVar1);
        if (0 < (int)this->_spectrum) {
          lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
          lVar8 = 0;
          lVar11 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar9 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar10 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar12 = 0;
                      lVar13 = lVar8;
                      do {
                        local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                             puVar15[lVar12];
                        lVar12 = lVar12 + 1;
                        lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                      } while (lVar12 < (int)this->_width);
                      puVar15 = puVar15 + lVar12;
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < (int)this->_height);
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < (int)this->_depth);
            }
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + lVar3;
          } while (lVar11 < (int)this->_spectrum);
        }
      }
      else if (uVar7 == 0x2301) {
        assign(&local_58,size_z,this->_spectrum,uVar1,uVar2);
        if (0 < (int)this->_spectrum) {
          lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
          iVar9 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar8 = 0;
                  lVar11 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar12 = 0;
                      lVar13 = lVar8;
                      do {
                        local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                             puVar15[lVar12];
                        lVar12 = lVar12 + 1;
                        lVar13 = lVar13 + lVar3;
                      } while (lVar12 < (int)this->_width);
                      puVar15 = puVar15 + lVar12;
                    }
                    lVar11 = lVar11 + 1;
                    lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
                  } while (lVar11 < (int)this->_height);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_depth);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)this->_spectrum);
        }
      }
      else if ((uVar7 == 0x2310) &&
              (assign(&local_58,size_z,this->_spectrum,uVar2,uVar1), 0 < (int)this->_spectrum)) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar8 = 0;
                lVar11 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar12 = 0;
                    lVar13 = lVar8;
                    do {
                      local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                           puVar15[lVar12];
                      lVar12 = lVar12 + 1;
                      lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                    } while (lVar12 < (int)this->_width);
                    puVar15 = puVar15 + lVar12;
                  }
                  lVar11 = lVar11 + 1;
                  lVar8 = lVar8 + lVar3;
                } while (lVar11 < (int)this->_height);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if (uVar7 < 0x3120) {
      if (uVar7 == 0x3012) {
        assign(&local_58,this->_spectrum,uVar1,uVar2,size_z);
        switch(this->_spectrum) {
        case 1:
          lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar3 != 0) {
            puVar15 = this->_data;
            lVar8 = 0;
            do {
              local_58._data[lVar8] = puVar15[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar3 - lVar8 != 0);
          }
          break;
        case 2:
          lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar3 != 0) {
            puVar15 = this->_data;
            lVar8 = 0;
            do {
              local_58._data[lVar8 * 2] = puVar15[lVar8];
              local_58._data[lVar8 * 2 + 1] = puVar15[lVar8 + lVar3];
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar3);
          }
          break;
        case 3:
          lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar3 != 0) {
            puVar15 = this->_data;
            lVar8 = 0;
            puVar4 = local_58._data;
            do {
              *puVar4 = puVar15[lVar8];
              puVar4[1] = puVar15[lVar8 + lVar3];
              puVar4[2] = puVar15[lVar8 + lVar3 * 2];
              puVar4 = puVar4 + 3;
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar3);
          }
          break;
        case 4:
          lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar3 != 0) {
            puVar15 = this->_data;
            lVar8 = 0;
            do {
              local_58._data[lVar8 * 4] = puVar15[lVar8];
              local_58._data[lVar8 * 4 + 1] = puVar15[lVar8 + lVar3];
              local_58._data[lVar8 * 4 + 2] = puVar15[lVar8 + lVar3 * 2];
              local_58._data[lVar8 * 4 + 3] = puVar15[lVar8 + lVar3 * 3];
              lVar8 = lVar8 + 1;
            } while (lVar8 != lVar3);
          }
          break;
        default:
          if (0 < (int)this->_spectrum) {
            lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
            iVar9 = 0;
            do {
              if (0 < (int)this->_depth) {
                lVar8 = 0;
                do {
                  if (0 < (int)this->_height) {
                    lVar11 = 0;
                    do {
                      if (0 < (int)this->_width) {
                        lVar13 = 0;
                        do {
                          local_58._data
                          [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar8 +
                           (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar11] =
                               puVar15[lVar13];
                          lVar13 = lVar13 + 1;
                        } while ((int)lVar13 < (int)this->_width);
                        puVar15 = puVar15 + lVar13;
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 < (int)this->_height);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < (int)this->_depth);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < (int)this->_spectrum);
          }
        }
      }
      else if (uVar7 == 0x3021) {
        assign(&local_58,this->_spectrum,uVar1,size_z,uVar2);
        if (0 < (int)this->_spectrum) {
          lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
          iVar9 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar8 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar11 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar13 = 0;
                      do {
                        local_58._data
                        [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                         (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar8] =
                             puVar15[lVar13];
                        lVar13 = lVar13 + 1;
                      } while ((int)lVar13 < (int)this->_width);
                      puVar15 = puVar15 + lVar13;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < (int)this->_height);
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < (int)this->_depth);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)this->_spectrum);
        }
      }
      else if ((uVar7 == 0x3102) &&
              (assign(&local_58,this->_spectrum,uVar2,uVar1,size_z), 0 < (int)this->_spectrum)) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar8 = 0;
            lVar11 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar12 = 0;
                    lVar13 = lVar8;
                    do {
                      local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                           puVar15[lVar12];
                      lVar12 = lVar12 + 1;
                      lVar13 = lVar13 + lVar3;
                    } while (lVar12 < (int)this->_width);
                    puVar15 = puVar15 + lVar12;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)this->_height);
              }
              lVar11 = lVar11 + 1;
              lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
            } while (lVar11 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if (uVar7 == 0x3120) {
      assign(&local_58,this->_spectrum,uVar2,size_z,uVar1);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar8 = 0;
            lVar11 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar12 = 0;
                    lVar13 = lVar8;
                    do {
                      local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                           puVar15[lVar12];
                      lVar12 = lVar12 + 1;
                      lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                    } while (lVar12 < (int)this->_width);
                    puVar15 = puVar15 + lVar12;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)this->_height);
              }
              lVar11 = lVar11 + 1;
              lVar8 = lVar8 + lVar3;
            } while (lVar11 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if (uVar7 == 0x3201) {
      assign(&local_58,this->_spectrum,size_z,uVar1,uVar2);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar10 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar8 = 0;
                lVar11 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar12 = 0;
                    lVar13 = lVar8;
                    do {
                      local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                           puVar15[lVar12];
                      lVar12 = lVar12 + 1;
                      lVar13 = lVar13 + lVar3;
                    } while (lVar12 < (int)this->_width);
                    puVar15 = puVar15 + lVar12;
                  }
                  lVar11 = lVar11 + 1;
                  lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
                } while (lVar11 < (int)this->_height);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if ((uVar7 == 0x3210) &&
            (assign(&local_58,this->_spectrum,size_z,uVar2,uVar1), 0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
      iVar9 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar8 = 0;
              lVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar13 = lVar8;
                  do {
                    local_58._data[lVar13 + (ulong)(local_58._width * iVar10 + iVar9)] =
                         puVar15[lVar12];
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                  } while (lVar12 < (int)this->_width);
                  puVar15 = puVar15 + lVar12;
                }
                lVar11 = lVar11 + 1;
                lVar8 = lVar8 + lVar3;
              } while (lVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)this->_spectrum);
    }
    goto LAB_0018cc3b;
  }
  if (uVar7 < 0x1023) {
    if (uVar7 < 0x231) {
      if (uVar7 == 0x123) {
        CImg(__return_storage_ptr__,this,false);
        goto LAB_0018ccaa;
      }
      if (uVar7 == 0x132) {
        assign(&local_58,uVar1,uVar2,this->_spectrum,size_z);
        if (0 < (int)this->_spectrum) {
          lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
          lVar8 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar11 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar9 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar13 = 0;
                      do {
                        local_58._data
                        [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                         (ulong)(local_58._width * iVar9 + (int)lVar13) + lVar3 * lVar8] =
                             puVar15[lVar13];
                        lVar13 = lVar13 + 1;
                      } while ((int)lVar13 < (int)this->_width);
                      puVar15 = puVar15 + lVar13;
                    }
                    iVar9 = iVar9 + 1;
                  } while (iVar9 < (int)this->_height);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < (int)this->_depth);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)this->_spectrum);
        }
      }
      else if ((uVar7 == 0x213) &&
              (assign(&local_58,uVar1,size_z,uVar2,this->_spectrum), 0 < (int)this->_spectrum)) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        lVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar9 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar11 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar13 = 0;
                    do {
                      local_58._data
                      [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar8 +
                       (ulong)(local_58._width * iVar9 + (int)lVar13) + lVar3 * lVar11] =
                           puVar15[lVar13];
                      lVar13 = lVar13 + 1;
                    } while ((int)lVar13 < (int)this->_width);
                    puVar15 = puVar15 + lVar13;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (int)this->_height);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < (int)this->_depth);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar7 == 0x231) {
      assign(&local_58,uVar1,size_z,this->_spectrum,uVar2);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        lVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            iVar9 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar11 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar13 = 0;
                    do {
                      local_58._data
                      [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                       (ulong)(local_58._width * iVar9 + (int)lVar13) + lVar3 * lVar8] =
                           puVar15[lVar13];
                      lVar13 = lVar13 + 1;
                    } while ((int)lVar13 < (int)this->_width);
                    puVar15 = puVar15 + lVar13;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (int)this->_height);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < (int)this->_depth);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar7 == 0x312) {
      assign(&local_58,uVar1,this->_spectrum,uVar2,size_z);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar8 = 0;
            do {
              if (0 < (int)this->_height) {
                lVar11 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar13 = 0;
                    do {
                      local_58._data
                      [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar8 +
                       (ulong)(local_58._width * iVar9 + (int)lVar13) + lVar3 * lVar11] =
                           puVar15[lVar13];
                      lVar13 = lVar13 + 1;
                    } while ((int)lVar13 < (int)this->_width);
                    puVar15 = puVar15 + lVar13;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (int)this->_height);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if ((uVar7 == 0x321) &&
            (assign(&local_58,uVar1,this->_spectrum,size_z,uVar2), 0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
      iVar9 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar8 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar13 = 0;
                  do {
                    local_58._data
                    [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                     (ulong)(local_58._width * iVar9 + (int)lVar13) + lVar3 * lVar8] =
                         puVar15[lVar13];
                    lVar13 = lVar13 + 1;
                  } while ((int)lVar13 < (int)this->_width);
                  puVar15 = puVar15 + lVar13;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < (int)this->_height);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)this->_depth);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)this->_spectrum);
    }
    goto LAB_0018cc3b;
  }
  if (uVar7 < 0x1230) {
    if (uVar7 == 0x1023) {
      assign(&local_58,uVar2,uVar1,size_z,this->_spectrum);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        lVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar11 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar9 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar13 = 0;
                    do {
                      local_58._data
                      [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar8 +
                       (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar11] =
                           puVar15[lVar13];
                      lVar13 = lVar13 + 1;
                    } while ((int)lVar13 < (int)this->_width);
                    puVar15 = puVar15 + lVar13;
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 < (int)this->_height);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)this->_depth);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_spectrum);
      }
    }
    else if (uVar7 == 0x1032) {
      assign(&local_58,uVar2,uVar1,this->_spectrum,size_z);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        lVar8 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar11 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar9 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar13 = 0;
                    do {
                      local_58._data
                      [(local_58._8_8_ & 0xffffffff) * lVar3 * lVar11 +
                       (ulong)(local_58._width * (int)lVar13 + iVar9) + lVar3 * lVar8] =
                           puVar15[lVar13];
                      lVar13 = lVar13 + 1;
                    } while ((int)lVar13 < (int)this->_width);
                    puVar15 = puVar15 + lVar13;
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 < (int)this->_height);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)this->_depth);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_spectrum);
      }
    }
    else if ((uVar7 == 0x1203) &&
            (assign(&local_58,uVar2,size_z,uVar1,this->_spectrum), 0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
      lVar8 = 0;
      lVar11 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar9 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar13 = lVar8;
                  do {
                    local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                         puVar15[lVar12];
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + lVar3;
                  } while (lVar12 < (int)this->_width);
                  puVar15 = puVar15 + lVar12;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)this->_depth);
        }
        lVar11 = lVar11 + 1;
        lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
      } while (lVar11 < (int)this->_spectrum);
    }
    goto LAB_0018cc3b;
  }
  if (uVar7 != 0x1230) {
    if (uVar7 == 0x1302) {
      assign(&local_58,uVar2,this->_spectrum,uVar1,size_z);
      if (0 < (int)this->_spectrum) {
        lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
        iVar9 = 0;
        do {
          if (0 < (int)this->_depth) {
            lVar8 = 0;
            lVar11 = 0;
            do {
              if (0 < (int)this->_height) {
                iVar10 = 0;
                do {
                  if (0 < (int)this->_width) {
                    lVar12 = 0;
                    lVar13 = lVar8;
                    do {
                      local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                           puVar15[lVar12];
                      lVar12 = lVar12 + 1;
                      lVar13 = lVar13 + lVar3;
                    } while (lVar12 < (int)this->_width);
                    puVar15 = puVar15 + lVar12;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)this->_height);
              }
              lVar11 = lVar11 + 1;
              lVar8 = lVar8 + (local_58._8_8_ & 0xffffffff) * lVar3;
            } while (lVar11 < (int)this->_depth);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)this->_spectrum);
      }
    }
    else if ((uVar7 == 0x1320) &&
            (assign(&local_58,uVar2,this->_spectrum,size_z,uVar1), 0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)local_58._0_8_ >> 0x20) * (local_58._0_8_ & 0xffffffff);
      iVar9 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar8 = 0;
          lVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar13 = lVar8;
                  do {
                    local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                         puVar15[lVar12];
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                  } while (lVar12 < (int)this->_width);
                  puVar15 = puVar15 + lVar12;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + lVar3;
          } while (lVar11 < (int)this->_depth);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)this->_spectrum);
    }
    goto LAB_0018cc3b;
  }
  assign(&local_58,uVar2,size_z,this->_spectrum,uVar1);
  switch(this->_width) {
  case 1:
    iVar9 = this->_depth * this->_height * this->_spectrum;
    if (iVar9 != 0) {
      lVar3 = 0;
      do {
        local_58._data[lVar3] = puVar15[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar9 != (int)lVar3);
    }
    break;
  case 2:
    iVar9 = this->_depth * this->_height * this->_spectrum;
    if (iVar9 != 0) {
      lVar3 = 0;
      do {
        local_58._data[lVar3] = puVar15[lVar3 * 2];
        local_58._data
        [lVar3 + (local_58._8_8_ & 0xffffffff) *
                 (local_58._0_8_ & 0xffffffff) * (ulong)local_58._height] = puVar15[lVar3 * 2 + 1];
        lVar3 = lVar3 + 1;
      } while (iVar9 != (int)lVar3);
    }
    break;
  case 3:
    iVar9 = this->_depth * this->_height * this->_spectrum;
    if (iVar9 != 0) {
      lVar3 = (local_58._8_8_ & 0xffffffff) *
              (local_58._0_8_ & 0xffffffff) * (ulong)local_58._height;
      lVar8 = 0;
      do {
        local_58._data[lVar8] = *puVar15;
        local_58._data[lVar8 + lVar3] = puVar15[1];
        local_58._data[lVar8 + lVar3 * 2] = puVar15[2];
        puVar15 = puVar15 + 3;
        lVar8 = lVar8 + 1;
      } while (iVar9 != (int)lVar8);
    }
    break;
  case 4:
    iVar9 = this->_depth * this->_height * this->_spectrum;
    if (iVar9 != 0) {
      lVar3 = (local_58._8_8_ & 0xffffffff) *
              (local_58._0_8_ & 0xffffffff) * (ulong)local_58._height;
      lVar8 = 0;
      do {
        local_58._data[lVar8] = puVar15[lVar8 * 4];
        local_58._data[lVar8 + lVar3] = puVar15[lVar8 * 4 + 1];
        local_58._data[lVar8 + lVar3 * 2] = puVar15[lVar8 * 4 + 2];
        local_58._data[lVar8 + lVar3 * 3] = puVar15[lVar8 * 4 + 3];
        lVar8 = lVar8 + 1;
      } while (iVar9 != (int)lVar8);
    }
    break;
  default:
    if (0 < (int)this->_spectrum) {
      lVar3 = (ulong)local_58._height * (local_58._0_8_ & 0xffffffff);
      lVar8 = 0;
      lVar11 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar9 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar13 = lVar8;
                  do {
                    local_58._data[lVar13 + (ulong)(local_58._width * iVar9 + iVar10)] =
                         puVar15[lVar12];
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + (local_58._8_8_ & 0xffffffff) * lVar3;
                  } while (lVar12 < (int)this->_width);
                  puVar15 = puVar15 + lVar12;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)this->_depth);
        }
        lVar11 = lVar11 + 1;
        lVar8 = lVar8 + lVar3;
      } while (lVar11 < (int)this->_spectrum);
    }
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
    __return_storage_ptr__->_width = local_58._width;
    uVar1 = __return_storage_ptr__->_height;
    __return_storage_ptr__->_height = local_58._height;
    local_58._0_8_ = (ulong)uVar1 << 0x20;
    uVar1 = __return_storage_ptr__->_depth;
    __return_storage_ptr__->_depth = local_58._depth;
    uVar2 = __return_storage_ptr__->_spectrum;
    __return_storage_ptr__->_spectrum = local_58._spectrum;
    local_58._spectrum = uVar2;
    local_58._depth = uVar1;
    goto LAB_0018cc8f;
  }
LAB_0018cc3b:
  if (local_58._data == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar14 = "non-";
    if (this->_is_shared != false) {
      pcVar14 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar14,"unsigned char",axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __return_storage_ptr__->_data = (uchar *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  uVar1 = __return_storage_ptr__->_width;
  __return_storage_ptr__->_width = local_58._width;
  uVar2 = __return_storage_ptr__->_height;
  __return_storage_ptr__->_height = local_58._height;
  local_58._height = uVar2;
  local_58._width = uVar1;
  uVar1 = __return_storage_ptr__->_depth;
  __return_storage_ptr__->_depth = local_58._depth;
  uVar2 = __return_storage_ptr__->_spectrum;
  __return_storage_ptr__->_spectrum = local_58._spectrum;
  local_58._spectrum = uVar2;
  local_58._depth = uVar1;
LAB_0018cc8f:
  __return_storage_ptr__->_data = local_58._data;
  local_58._data = (uchar *)0x0;
  bVar16 = __return_storage_ptr__->_is_shared;
  __return_storage_ptr__->_is_shared = local_58._is_shared;
  local_58._is_shared = bVar16;
LAB_0018ccaa:
  if ((local_58._is_shared == false) && (local_58._data != (uchar *)0x0)) {
    operator_delete__(local_58._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }